

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep.cpp
# Opt level: O0

bool __thiscall
ON_Brep::SetTrimCurve(ON_Brep *this,ON_BrepTrim *trim,int c2_index,ON_Interval *sub_domain)

{
  bool bVar1;
  int iVar2;
  ON_Curve **ppOVar3;
  ON_Interval *local_a8;
  ON_BoundingBox local_80;
  double local_50;
  double local_48;
  undefined1 local_40 [8];
  ON_Interval curve_domain;
  bool rc;
  ON_Interval *sub_domain_local;
  int c2_index_local;
  ON_BrepTrim *trim_local;
  ON_Brep *this_local;
  
  curve_domain.m_t[1]._7_1_ = 0;
  if ((c2_index == -1) && (sub_domain == (ON_Interval *)0x0)) {
    trim->m_c2i = -1;
    ON_CurveProxy::SetProxyCurve(&trim->super_ON_CurveProxy,(ON_Curve *)0x0);
    ON_BrepTrim::DestroyPspaceInformation(trim);
    curve_domain.m_t[1]._7_1_ = 1;
  }
  else if (((-1 < c2_index) &&
           (iVar2 = ON_SimpleArray<ON_Curve_*>::Count
                              (&(this->m_C2).super_ON_SimpleArray<ON_Curve_*>), c2_index <= iVar2))
          && (ppOVar3 = ON_SimpleArray<ON_Curve_*>::operator[]
                                  (&(this->m_C2).super_ON_SimpleArray<ON_Curve_*>,c2_index),
             *ppOVar3 != (ON_Curve *)0x0)) {
    ppOVar3 = ON_SimpleArray<ON_Curve_*>::operator[]
                        (&(this->m_C2).super_ON_SimpleArray<ON_Curve_*>,c2_index);
    (*((*ppOVar3)->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x25])();
    if ((sub_domain == (ON_Interval *)0x0) ||
       ((bVar1 = ON_Interval::IsIncreasing(sub_domain), bVar1 &&
        (bVar1 = ON_Interval::Includes((ON_Interval *)local_40,sub_domain,false), bVar1)))) {
      trim->m_c2i = c2_index;
      ppOVar3 = ON_SimpleArray<ON_Curve_*>::operator[]
                          (&(this->m_C2).super_ON_SimpleArray<ON_Curve_*>,trim->m_c2i);
      local_a8 = sub_domain;
      if (sub_domain == (ON_Interval *)0x0) {
        local_a8 = (ON_Interval *)local_40;
      }
      local_50 = local_a8->m_t[0];
      local_48 = local_a8->m_t[1];
      ON_CurveProxy::SetProxyCurve(&trim->super_ON_CurveProxy,*ppOVar3,(ON_Interval)*&local_a8->m_t)
      ;
      ppOVar3 = ON_SimpleArray<ON_Curve_*>::operator[]
                          (&(this->m_C2).super_ON_SimpleArray<ON_Curve_*>,trim->m_c2i);
      ON_Geometry::BoundingBox(&local_80,&(*ppOVar3)->super_ON_Geometry);
      memcpy(&trim->m_pbox,&local_80,0x30);
      (trim->m_pbox).m_min.z = 0.0;
      (trim->m_pbox).m_max.z = 0.0;
      curve_domain.m_t[1]._7_1_ = 1;
    }
  }
  return (bool)(curve_domain.m_t[1]._7_1_ & 1);
}

Assistant:

bool ON_Brep::SetTrimCurve( 
  ON_BrepTrim& trim,
  int c2_index,
  const ON_Interval* sub_domain
  )
{
  bool rc = false;
  if ( c2_index == - 1 && !sub_domain )
  {
    trim.m_c2i = -1;
    trim.SetProxyCurve(0);
    //June 18 2013 - Chuck - nuke the bounding box and pline since it came from the old 2d curve.
    trim.DestroyPspaceInformation();
    rc = true;
  }
  else if ( c2_index >= 0 && c2_index <= m_C2.Count() && m_C2[c2_index] )
  {
    ON_Interval curve_domain = m_C2[c2_index]->Domain();
    if ( !sub_domain || (sub_domain->IsIncreasing() && curve_domain.Includes(*sub_domain)) )
    {
      trim.m_c2i = c2_index;
      trim.SetProxyCurve( m_C2[trim.m_c2i], (sub_domain) ? *sub_domain : curve_domain );
      trim.m_pbox = m_C2[trim.m_c2i]->BoundingBox();
      trim.m_pbox.m_min.z = 0.0;
      trim.m_pbox.m_max.z = 0.0;
      rc = true;
    }
  }
  return rc;
}